

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

PluralRules * __thiscall icu_63::PluralRules::operator=(PluralRules *this,PluralRules *other)

{
  UErrorCode UVar1;
  RuleChain *this_00;
  PluralRules *size;
  
  if (this != other) {
    size = other;
    if (this->mRules != (RuleChain *)0x0) {
      (*this->mRules->_vptr_RuleChain[1])();
    }
    this->mRules = (RuleChain *)0x0;
    UVar1 = other->mInternalStatus;
    this->mInternalStatus = UVar1;
    if ((UVar1 < U_ILLEGAL_ARGUMENT_ERROR) && (other->mRules != (RuleChain *)0x0)) {
      this_00 = (RuleChain *)UMemory::operator_new((UMemory *)0xe0,(size_t)size);
      if (this_00 == (RuleChain *)0x0) {
        this->mRules = (RuleChain *)0x0;
        UVar1 = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        RuleChain::RuleChain(this_00,other->mRules);
        this->mRules = this_00;
        UVar1 = this_00->fInternalStatus;
        if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
          return this;
        }
      }
      this->mInternalStatus = UVar1;
    }
  }
  return this;
}

Assistant:

PluralRules&
PluralRules::operator=(const PluralRules& other) {
    if (this != &other) {
        delete mRules;
        mRules = nullptr;
        mInternalStatus = other.mInternalStatus;
        if (U_FAILURE(mInternalStatus)) {
            // bail out early if the object we were copying from was already 'invalid'.
            return *this;
        }
        if (other.mRules != nullptr) {
            mRules = new RuleChain(*other.mRules);
            if (mRules == nullptr) {
                mInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            }
            else if (U_FAILURE(mRules->fInternalStatus)) {
                // If the RuleChain wasn't fully copied, then set our status to failure as well.
                mInternalStatus = mRules->fInternalStatus;
            }
        }
    }
    return *this;
}